

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

size_t __thiscall
booster::aio::stream_socket::write_some(stream_socket *this,const_buffer *buffer,error_code *e)

{
  ssize_t sVar1;
  int in_ECX;
  iovec *in_RDX;
  int in_ESI;
  stream_socket *in_RDI;
  error_code eVar2;
  int n;
  void *local_48;
  error_category *local_40;
  undefined4 uStack_34;
  int local_24;
  iovec *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  sVar1 = writev(in_RDI,in_ESI,in_RDX,in_ECX);
  local_24 = (int)sVar1;
  if (local_24 < 0) {
    eVar2 = socket_details::geterror();
    local_20->iov_base = (void *)CONCAT44(uStack_34,eVar2._M_value);
    local_20->iov_len = (size_t)eVar2._M_cat;
    local_8 = 0;
  }
  else if (local_24 == 0) {
    std::error_code::error_code((error_code *)&local_48,3,aio_error_cat);
    local_20->iov_base = local_48;
    local_20->iov_len = (size_t)local_40;
    local_8 = 0;
  }
  else {
    local_8 = (size_t)local_24;
  }
  return local_8;
}

Assistant:

size_t stream_socket::write_some(const_buffer const &buffer,system::error_code &e)
{
	int n=writev(buffer);
	if(n < 0) {
		e=geterror();
		return 0;
	}
	if(n == 0) {
		e=system::error_code(aio_error::eof,aio_error_cat);
		return 0;
	}
	return n;
}